

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>::
createInstance(TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>
               *this,Context *context)

{
  TextureCubeBaseLevelTestInstance *this_00;
  Context *context_local;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance> *this_local
  ;
  
  this_00 = (TextureCubeBaseLevelTestInstance *)operator_new(0x308);
  texture::anon_unknown_0::TextureCubeBaseLevelTestInstance::TextureCubeBaseLevelTestInstance
            (this_00,context,&this->m_testsParameters);
  return (TestInstance *)this_00;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}